

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger string_split(HSQUIRRELVM v)

{
  int iVar1;
  SQInteger SVar2;
  SQString *pSVar3;
  SQRESULT SVar4;
  HSQUIRRELVM in_RDI;
  SQInteger pos_1;
  SQInteger start_1;
  SQInteger sep_len;
  SQChar *sep;
  SQInteger pos;
  SQInteger start;
  SQArray *res;
  SQInteger len;
  SQChar *str;
  SQChar *in_stack_ffffffffffffff18;
  SQSharedState *in_stack_ffffffffffffff20;
  SQObjectPtr *this;
  SQObjectValue in_stack_ffffffffffffff28;
  SQSharedState *in_stack_ffffffffffffff30;
  HSQUIRRELVM in_stack_ffffffffffffff38;
  SQObject *in_stack_ffffffffffffff48;
  SQObjectValue o;
  SQArray *in_stack_ffffffffffffff50;
  SQArray *this_00;
  SQObjectPtr local_a8;
  undefined1 local_98 [96];
  SQAllocContext local_38;
  SQAllocContext local_30;
  SQObjectValue local_28;
  SQAllocContext local_20;
  SQObjectValue local_18;
  HSQUIRRELVM local_10;
  
  local_10 = in_RDI;
  sq_getstringandsize(in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30,
                      (SQChar **)in_stack_ffffffffffffff28.pTable,
                      (SQInteger *)in_stack_ffffffffffffff20);
  local_28.pArray = SQArray::Create(in_stack_ffffffffffffff20,(SQInteger)in_stack_ffffffffffffff18);
  SVar2 = sq_gettop(local_10);
  if (SVar2 == 1) {
    local_30 = (SQAllocContext)0x0;
    for (local_38 = (SQAllocContext)0x0; (long)local_38 <= (long)local_20; local_38 = local_38 + 1)
    {
      if ((local_38 == local_20) ||
         (iVar1 = isspace((int)(char)local_38[(long)&((local_18.pTable)->super_SQDelegable).
                                                     super_SQCollectable.super_SQRefCounted]),
         iVar1 != 0)) {
        if ((long)local_30 < (long)local_38) {
          o = local_28;
          pSVar3 = SQString::Create(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28.pString,
                                    (SQInteger)in_stack_ffffffffffffff20);
          this_00 = (SQArray *)(local_98 + 0x50);
          SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00,pSVar3);
          SQArray::Append(this_00,(SQObject *)o.pTable);
          SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff20);
        }
        local_30 = local_38 + 1;
      }
    }
  }
  else {
    sq_getstringandsize(in_stack_ffffffffffffff38,(SQInteger)in_stack_ffffffffffffff30,
                        (SQChar **)in_stack_ffffffffffffff28.pTable,
                        (SQInteger *)in_stack_ffffffffffffff20);
    if ((long)local_98._48_8_ < 1) {
      SVar4 = sq_throwerror((HSQUIRRELVM)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      return SVar4;
    }
    local_98._40_8_ = (SQObjectPtrVec *)0x0;
    local_98._32_8_ = (SQObjectPtrVec *)0x0;
    while ((long)local_98._32_8_ <= (long)local_20) {
      if ((long)local_20 - local_98._48_8_ < (long)local_98._32_8_) {
        pSVar3 = SQString::Create(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28.pString,
                                  (SQInteger)in_stack_ffffffffffffff20);
        SQObjectPtr::SQObjectPtr((SQObjectPtr *)(local_98 + 0x10),pSVar3);
        SQArray::Append(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff20);
        break;
      }
      iVar1 = strncmp((char *)((long)(SQObjectPtr **)local_98._32_8_ +
                              (long)&(local_18.pTable)->super_SQDelegable),(char *)local_98._56_8_,
                      local_98._48_8_);
      if (iVar1 == 0) {
        in_stack_ffffffffffffff28 = local_28;
        pSVar3 = SQString::Create(in_stack_ffffffffffffff30,local_28.pString,
                                  (SQInteger)in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff30 = (SQSharedState *)local_98;
        SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff30,pSVar3);
        SQArray::Append(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff20);
        local_98._32_8_ =
             (long)(SQObjectPtr **)local_98._32_8_ + (long)(SQString ***)local_98._48_8_;
        local_98._40_8_ = local_98._32_8_;
      }
      else {
        local_98._32_8_ = (long)(SQObjectPtr **)local_98._32_8_ + 1;
      }
    }
  }
  this = &local_a8;
  SQObjectPtr::SQObjectPtr(this,local_28.pArray);
  SQVM::Push((SQVM *)in_stack_ffffffffffffff30,(SQObjectPtr *)in_stack_ffffffffffffff28.pTable);
  SQObjectPtr::~SQObjectPtr(this);
  return 1;
}

Assistant:

static SQInteger string_split(HSQUIRRELVM v)
{
    const SQChar *str;
    SQInteger len;
    sq_getstringandsize(v, 1, &str, &len);

    SQArray *res = SQArray::Create(_ss(v),0);

    if (sq_gettop(v) == 1) {
        SQInteger start = 0;
        for (SQInteger pos=0; pos<=len; ++pos) {
            if (pos==len || isspace(str[pos])) {
                if (pos > start)
                    res->Append(SQObjectPtr(SQString::Create(_ss(v), str+start, pos-start)));
                start = pos+1;
            }
        }
    } else {
        const SQChar *sep;
        SQInteger sep_len;
        sq_getstringandsize(v, 2, &sep, &sep_len);
        if (sep_len < 1)
            return sq_throwerror(v, _SC("empty separator"));
        SQInteger start = 0;
        for (SQInteger pos=0; pos<=len;) {
            if (pos>len-sep_len) {
                res->Append(SQObjectPtr(SQString::Create(_ss(v), str+start, len-start)));
                break;
            }
            else if (strncmp(str+pos, sep, sep_len)==0) {
                res->Append(SQObjectPtr(SQString::Create(_ss(v), str+start, pos-start)));
                pos += sep_len;
                start = pos;
            }
            else
                ++pos;
        }
    }
    v->Push(res);
    return 1;
}